

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::BrOnExnExpr::BrOnExnExpr(BrOnExnExpr *this,Location *loc)

{
  Location local_58;
  Location local_38;
  Location *local_18;
  Location *loc_local;
  BrOnExnExpr *this_local;
  
  local_18 = loc;
  loc_local = (Location *)this;
  ExprMixin<(wabt::ExprType)10>::ExprMixin(&this->super_ExprMixin<(wabt::ExprType)10>,loc);
  (this->super_ExprMixin<(wabt::ExprType)10>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__BrOnExnExpr_0035fca8;
  Location::Location(&local_38);
  Var::Var(&this->label_var,0xffffffff,&local_38);
  Location::Location(&local_58);
  Var::Var(&this->event_var,0xffffffff,&local_58);
  return;
}

Assistant:

BrOnExnExpr(const Location& loc = Location())
      : ExprMixin<ExprType::BrOnExn>(loc) {}